

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

string * __thiscall
pstack::Context::linkResolve(string *__return_storage_ptr__,Context *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  ssize_t sVar5;
  int *piVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *psVar9;
  size_type sVar10;
  size_type __len1;
  ulong uVar11;
  undefined8 uVar12;
  char local_4b8 [8];
  char buf [1024];
  undefined1 local_b0 [8];
  string orig;
  size_type local_88;
  ulong local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0 = (undefined1  [8])&orig._M_string_length;
  pcVar3 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar3,pcVar3 + name->_M_string_length);
  sVar5 = readlink((name->_M_dataplus)._M_p,local_4b8,0x3ff);
  if ((int)sVar5 != -1) {
    paVar1 = &local_70.field_2;
    buf._1016_8_ = __return_storage_ptr__;
    do {
      local_4b8[(int)sVar5] = '\0';
      __len1 = name->_M_string_length;
      if (local_4b8[0] == '/') {
        sVar7 = strlen(local_4b8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (name,0,__len1,local_4b8,sVar7);
      }
      else {
        if (__len1 == 0) {
LAB_001572be:
          sVar10 = 0xffffffffffffffff;
        }
        else {
          do {
            sVar10 = __len1 - 1;
            if (__len1 == 0) goto LAB_001572be;
            lVar4 = __len1 - 1;
            __len1 = sVar10;
          } while ((name->_M_dataplus)._M_p[lVar4] != '/');
        }
        if (sVar10 == 0xffffffffffffffff) {
          local_70._M_dataplus._M_p = (pointer)paVar1;
          sVar7 = strlen(local_4b8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,local_4b8,local_4b8 + sVar7);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&orig.field_2 + 8),name,0,sVar10 + 1);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar7 = strlen(local_4b8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,local_4b8,local_4b8 + sVar7);
          uVar11 = 0xf;
          if ((ulong *)orig.field_2._8_8_ != &stack0xffffffffffffff80) {
            uVar11 = local_80;
          }
          if (uVar11 < local_50._M_string_length + local_88) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              uVar12 = local_50.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_50._M_string_length + local_88) goto LAB_00157396;
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_50,0,0,(char *)orig.field_2._8_8_,local_88);
          }
          else {
LAB_00157396:
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&orig.field_2 + 8),local_50._M_dataplus._M_p,
                                 local_50._M_string_length);
          }
          local_70._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar2 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == paVar2) {
            local_70.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
            local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_70._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_70.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
          }
          local_70._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar2;
          pbVar8->_M_string_length = 0;
          paVar2->_M_local_buf[0] = '\0';
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (name,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        __return_storage_ptr__ = (string *)buf._1016_8_;
        if (sVar10 != 0xffffffffffffffff) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((ulong *)orig.field_2._8_8_ != &stack0xffffffffffffff80) {
            operator_delete((void *)orig.field_2._8_8_,local_80 + 1);
          }
        }
      }
      sVar5 = readlink((name->_M_dataplus)._M_p,local_4b8,0x3ff);
    } while ((int)sVar5 != -1);
  }
  piVar6 = __errno_location();
  psVar9 = (string *)local_b0;
  if (*piVar6 == 0x16) {
    psVar9 = name;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar9->_M_string_length);
  if (local_b0 != (undefined1  [8])&orig._M_string_length) {
    operator_delete((void *)local_b0,orig._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Context::linkResolve(std::string name)
{
    char buf[1024];
    std::string orig = name;
    int rc;
    for (;;) {
        rc = readlink(name.c_str(), buf, sizeof buf - 1);
        // some files in /proc are links, but report "(deleted)" in the name if
        // the original has gone away. Opening such files works, and uses the
        // in-core inode, so use that if we can
        if (rc == -1) {
            return errno == EINVAL ? name : orig;
        }
        buf[rc] = 0;
        if (buf[0] != '/') {
            auto lastSlash = name.rfind('/');
            name = lastSlash == std::string::npos
               ? std::string(buf)
               : name.substr(0, lastSlash + 1) + std::string(buf);
        } else {
            name = buf;
        }
    }
    return name;
}